

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall polyscope::render::backend_openGL3_glfw::GLEngine::initialize(GLEngine *this)

{
  int iVar1;
  GLFWwindow *handle;
  ostream *poVar2;
  GLubyte *__s;
  size_t sVar3;
  GLFrameBuffer *this_00;
  int newWindowHeight;
  int newWindowWidth;
  int newBufferHeight;
  int newBufferWidth;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int local_80;
  int local_7c;
  uint local_78;
  uint local_74;
  string local_70;
  string local_50;
  
  glfwSetErrorCallback(initialize::anon_class_1_0_00000001::__invoke);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,options::printPrefix_abi_cxx11_,
               options::printPrefix_abi_cxx11_ + DAT_005f9b00);
    std::__cxx11::string::append((char *)&local_50);
    exception(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  glfwWindowHint(0x22002,3);
  glfwWindowHint(0x22003,3);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x20004,0);
  glfwWindowHint(0x2000c,0);
  handle = glfwCreateWindow(view::windowWidth,view::windowHeight,options::programName_abi_cxx11_,
                            (GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  this->mainWindow = handle;
  glfwMakeContextCurrent(handle);
  glfwSetWindowPos(this->mainWindow,view::initWindowPosX,view::initWindowPosY);
  glfwGetFramebufferSize(this->mainWindow,(int *)&local_74,(int *)&local_78);
  glfwGetWindowSize(this->mainWindow,&local_7c,&local_80);
  view::bufferWidth = local_74;
  view::bufferHeight = local_78;
  view::windowWidth = local_7c;
  view::windowHeight = local_80;
  (*(this->super_Engine)._vptr_Engine[0x14])(this,(ulong)view::windowResizable);
  iVar1 = gladLoadGL();
  if (iVar1 == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,options::printPrefix_abi_cxx11_,
               options::printPrefix_abi_cxx11_ + DAT_005f9b00);
    std::__cxx11::string::append((char *)&local_70);
    exception(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if (0 < options::verbosity) {
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,options::printPrefix_abi_cxx11_,DAT_005f9b00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Backend: openGL3_glfw -- ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Loaded openGL version: ",0x17);
    __s = (*glad_glGetString)(0x1f02);
    if (__s == (GLubyte *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen((char *)__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)__s,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  this_00 = (GLFrameBuffer *)operator_new(0xb0);
  GLFrameBuffer::GLFrameBuffer(this_00,view::bufferWidth,view::bufferHeight,true);
  std::__shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>::
  reset<polyscope::render::backend_openGL3_glfw::GLFrameBuffer>
            (&(this->super_Engine).displayBuffer.
              super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>,this_00
            );
  (*(this_00->super_FrameBuffer)._vptr_FrameBuffer[2])(this_00);
  (*glad_glClearColor)(1.0,1.0,1.0,0.0);
  populateDefaultShadersAndRules(this);
  return;
}

Assistant:

void GLEngine::initialize() {
  // Small callback function for GLFW errors
  auto error_print_callback = [](int error, const char* description) {
    if (polyscope::options::verbosity > 0) {
      std::cout << "GLFW emitted error: " << description << std::endl;
    }
  };

  // === Initialize glfw
  glfwSetErrorCallback(error_print_callback);
  if (!glfwInit()) {
    exception(options::printPrefix + "ERROR: Failed to initialize glfw");
  }

  // OpenGL version things
  glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
  glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
  glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#if __APPLE__
  glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
#endif

  // Create the window with context
  glfwWindowHint(GLFW_VISIBLE, GLFW_FALSE);
  glfwWindowHint(GLFW_FOCUS_ON_SHOW, GLFW_FALSE);
  mainWindow = glfwCreateWindow(view::windowWidth, view::windowHeight, options::programName.c_str(), NULL, NULL);
  glfwMakeContextCurrent(mainWindow);
  glfwSetWindowPos(mainWindow, view::initWindowPosX, view::initWindowPosY);

  // Set initial window size
  int newBufferWidth, newBufferHeight, newWindowWidth, newWindowHeight;
  glfwGetFramebufferSize(mainWindow, &newBufferWidth, &newBufferHeight);
  glfwGetWindowSize(mainWindow, &newWindowWidth, &newWindowHeight);
  view::bufferWidth = newBufferWidth;
  view::bufferHeight = newBufferHeight;
  view::windowWidth = newWindowWidth;
  view::windowHeight = newWindowHeight;

  setWindowResizable(view::windowResizable);

// === Initialize openGL
// Load openGL functions (using GLAD)
#ifndef __APPLE__
  if (!gladLoadGL()) {
    exception(options::printPrefix + "ERROR: Failed to load openGL using GLAD");
  }
#endif
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << "Backend: openGL3_glfw -- "
              << "Loaded openGL version: " << glGetString(GL_VERSION) << std::endl;
  }

#ifdef __APPLE__
  // Hack to classify the process as interactive
  glfwPollEvents();
#endif

  { // Manually create the screen frame buffer
    GLFrameBuffer* glScreenBuffer = new GLFrameBuffer(view::bufferWidth, view::bufferHeight, true);
    displayBuffer.reset(glScreenBuffer);
    glScreenBuffer->bind();
    glClearColor(1., 1., 1., 0.);
    // glClearColor(0., 0., 0., 0.);
    // glClearDepth(1.);
  }

  populateDefaultShadersAndRules();
}